

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::SSLClient::connect_with_proxy
          (SSLClient *this,Socket *socket,Response *res,bool *success,Error *error)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  ulong uVar4;
  undefined1 *in_RCX;
  undefined4 *in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  socket_t sock;
  Response res3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  auth;
  Response res2;
  undefined6 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8e;
  undefined1 in_stack_fffffffffffffc8f;
  ClientImpl *in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  function<bool_(httplib::Stream_&)> *in_stack_fffffffffffffca0;
  function<bool_(httplib::Stream_&)> *callback;
  long write_timeout_usec;
  time_t in_stack_fffffffffffffd08;
  long *write_timeout_sec;
  time_t in_stack_fffffffffffffd10;
  undefined1 *read_timeout_usec;
  time_t in_stack_fffffffffffffd18;
  ClientImpl *read_timeout_sec;
  undefined8 in_stack_fffffffffffffd20;
  socket_t sock_00;
  bool local_180;
  undefined3 uStack_17f;
  undefined1 *local_168;
  int local_118;
  undefined1 in_stack_ffffffffffffff2f;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  byte local_1;
  
  sock_00 = (socket_t)((ulong)in_stack_fffffffffffffd20 >> 0x20);
  sock = (socket_t)((ulong)in_R8 >> 0x20);
  *in_RCX = 1;
  Response::Response((Response *)in_stack_fffffffffffffc90);
  callback = (function<bool_(httplib::Stream_&)> *)in_RDI[0x31];
  write_timeout_usec = in_RDI[0x32];
  local_168 = &stack0xfffffffffffffec8;
  std::function<bool(httplib::Stream&)>::
  function<httplib::SSLClient::connect_with_proxy(httplib::ClientImpl::Socket&,httplib::Response&,bool&,httplib::Error&)::_lambda(httplib::Stream&)_1_,void>
            (in_stack_fffffffffffffca0,
             (anon_class_24_3_cc83523b *)
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  bVar1 = detail::process_client_socket
                    (sock_00,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                     in_stack_fffffffffffffd08,write_timeout_usec,callback);
  std::function<bool_(httplib::Stream_&)>::~function((function<bool_(httplib::Stream_&)> *)0x12371a)
  ;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    (**(code **)(*in_RDI + 0x20))(in_RDI,in_RSI,1);
    ClientImpl::shutdown_socket
              (in_stack_fffffffffffffc90,
               (Socket *)
               CONCAT17(in_stack_fffffffffffffc8f,
                        CONCAT16(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88)));
    ClientImpl::close_socket
              (in_stack_fffffffffffffc90,
               (Socket *)
               CONCAT17(in_stack_fffffffffffffc8f,
                        CONCAT16(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88)));
    *in_RCX = 0;
    local_1 = 0;
    _local_180 = 1;
    goto LAB_00123aa1;
  }
  if (local_118 == 0x197) {
    uVar4 = std::__cxx11::string::empty();
    if (((uVar4 & 1) != 0) || (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) != 0)) {
      Response::operator=((Response *)in_stack_fffffffffffffc90,
                          (Response *)
                          CONCAT17(in_stack_fffffffffffffc8f,
                                   CONCAT16(in_stack_fffffffffffffc8e,in_stack_fffffffffffffc88)));
      local_1 = 0;
      _local_180 = 1;
      goto LAB_00123aa1;
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x123823);
    bVar1 = detail::parse_www_authenticate
                      ((Response *)in_stack_ffffffffffffff38,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffff30,(bool)in_stack_ffffffffffffff2f);
    if (bVar1) {
      in_stack_fffffffffffffc90 = (ClientImpl *)&stack0xfffffffffffffd48;
      Response::Response((Response *)in_stack_fffffffffffffc90);
      read_timeout_usec = &stack0xfffffffffffffe50;
      write_timeout_sec = in_RDI;
      read_timeout_sec = in_stack_fffffffffffffc90;
      std::function<bool(httplib::Stream&)>::
      function<httplib::SSLClient::connect_with_proxy(httplib::ClientImpl::Socket&,httplib::Response&,bool&,httplib::Error&)::_lambda(httplib::Stream&)_2_,void>
                ((function<bool_(httplib::Stream_&)> *)in_RDI[0x2f],
                 (anon_class_32_4_86ec7540 *)CONCAT44(*in_RSI,in_stack_fffffffffffffc98));
      uVar2 = detail::process_client_socket
                        (sock,(time_t)read_timeout_sec,(time_t)read_timeout_usec,
                         (time_t)write_timeout_sec,write_timeout_usec,callback);
      bVar3 = uVar2 ^ 0xff;
      std::function<bool_(httplib::Stream_&)>::~function
                ((function<bool_(httplib::Stream_&)> *)0x123930);
      local_180 = (bVar3 & 1) != 0;
      if (local_180) {
        (**(code **)(*in_RDI + 0x20))(in_RDI,in_RSI,1);
        ClientImpl::shutdown_socket
                  (in_stack_fffffffffffffc90,
                   (Socket *)CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffc88)));
        ClientImpl::close_socket
                  (in_stack_fffffffffffffc90,
                   (Socket *)CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffc88)));
        *in_RCX = 0;
        local_1 = 0;
      }
      uStack_17f = 0;
      Response::~Response((Response *)in_stack_fffffffffffffc90);
      if (_local_180 == 0) goto LAB_00123a2a;
    }
    else {
LAB_00123a2a:
      _local_180 = 0;
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x123a42);
    if (_local_180 != 0) goto LAB_00123aa1;
  }
  local_1 = 1;
  _local_180 = 1;
LAB_00123aa1:
  Response::~Response((Response *)in_stack_fffffffffffffc90);
  return (bool)(local_1 & 1);
}

Assistant:

inline bool SSLClient::connect_with_proxy(Socket & socket, Response & res,
        bool& success, Error & error) {
        success = true;
        Response res2;
        if (!detail::process_client_socket(
            socket.sock, read_timeout_sec_, read_timeout_usec_,
            write_timeout_sec_, write_timeout_usec_, [&](Stream& strm) {
            Request req2;
            req2.method = "CONNECT";
            req2.path = host_and_port_;
            return process_request(strm, req2, res2, false, error);
        })) {
            // Thread-safe to close everything because we are assuming there are no
            // requests in flight
            shutdown_ssl(socket, true);
            shutdown_socket(socket);
            close_socket(socket);
            success = false;
            return false;
        }

        if (res2.status == 407) {
            if (!proxy_digest_auth_username_.empty() &&
                !proxy_digest_auth_password_.empty()) {
                std::map<std::string, std::string> auth;
                if (detail::parse_www_authenticate(res2, auth, true)) {
                    Response res3;
                    if (!detail::process_client_socket(
                        socket.sock, read_timeout_sec_, read_timeout_usec_,
                        write_timeout_sec_, write_timeout_usec_, [&](Stream& strm) {
                        Request req3;
                        req3.method = "CONNECT";
                        req3.path = host_and_port_;
                        req3.headers.insert(detail::make_digest_authentication_header(
                            req3, auth, 1, detail::random_string(10),
                            proxy_digest_auth_username_, proxy_digest_auth_password_,
                            true));
                        return process_request(strm, req3, res3, false, error);
                    })) {
                        // Thread-safe to close everything because we are assuming there are
                        // no requests in flight
                        shutdown_ssl(socket, true);
                        shutdown_socket(socket);
                        close_socket(socket);
                        success = false;
                        return false;
                    }
                }
            } else {
                res = res2;
                return false;
            }
        }

        return true;
    }